

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall Assimp::OpenGEX::OpenGEXImporter::copyCameras(OpenGEXImporter *this,aiScene *pScene)

{
  pointer ppaVar1;
  pointer ppaVar2;
  ulong uVar3;
  aiCamera **__dest;
  size_t __n;
  
  if (pScene == (aiScene *)0x0) {
    __assert_fail("nullptr != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                  ,0x48c,"void Assimp::OpenGEX::OpenGEXImporter::copyCameras(aiScene *)");
  }
  ppaVar1 = (this->m_cameraCache).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppaVar2 = (this->m_cameraCache).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppaVar1 != ppaVar2) {
    uVar3 = (long)ppaVar2 - (long)ppaVar1;
    pScene->mNumCameras = (uint)(uVar3 >> 3);
    __dest = (aiCamera **)operator_new__(uVar3 & 0x7fffffff8);
    pScene->mCameras = __dest;
    ppaVar1 = (this->m_cameraCache).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    __n = (long)(this->m_cameraCache).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppaVar1;
    if (__n != 0) {
      memmove(__dest,ppaVar1,__n);
      return;
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::copyCameras( aiScene *pScene ) {
    ai_assert( nullptr != pScene );

    if ( m_cameraCache.empty() ) {
        return;
    }

    pScene->mNumCameras = static_cast<unsigned int>(m_cameraCache.size());
    pScene->mCameras = new aiCamera*[ pScene->mNumCameras ];
    std::copy( m_cameraCache.begin(), m_cameraCache.end(), pScene->mCameras );
}